

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

fsg_model_t * fsg_model_read(FILE *fp,logmath_t *lmath,float32 lw)

{
  hash_table_t *phVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int32 iVar5;
  char *pcVar6;
  hash_iter_t *phVar7;
  fsg_model_t *fsg;
  fsg_link_t *ptr;
  glist_t pgVar8;
  char **ppcVar9;
  char *pcVar10;
  long lVar11;
  size_t n_elem;
  ulong in_R8;
  ulong uVar12;
  float fVar13;
  double dVar14;
  int32 lineno;
  char **wordptr;
  int32 j;
  int32 i;
  char *lineptr;
  FILE *local_68;
  ulong local_60;
  hash_table_t *local_58;
  int local_50;
  int32 wid;
  ulong local_48;
  logmath_t *local_40;
  int n_state;
  
  local_60 = CONCAT44(local_60._4_4_,lw);
  lineno = 0;
  local_68 = fp;
  local_40 = lmath;
  local_58 = hash_table_new(0x20,0);
  wordptr = (char **)0x0;
  lineptr = (char *)0x0;
  do {
    uVar3 = nextline_str2words(local_68,&lineno,&lineptr,&wordptr);
    ppcVar9 = wordptr;
    if ((int)uVar3 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x21f,"%s declaration missing\n","FSG_BEGIN");
      goto LAB_0010539d;
    }
    iVar4 = strcmp(*wordptr,"FSG_BEGIN");
  } while (iVar4 != 0);
  if (uVar3 < 3) {
    if (uVar3 == 2) {
      pcVar6 = ppcVar9[1];
      iVar4 = 0x230;
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x233,"FSG name is missing\n");
      pcVar6 = "unknown";
      iVar4 = 0x234;
    }
    pcVar6 = __ckd_salloc__(pcVar6,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,iVar4);
    iVar5 = nextline_str2words(local_68,&lineno,&lineptr,&wordptr);
    ppcVar9 = wordptr;
    if ((iVar5 == 2) &&
       ((((pcVar10 = *wordptr, *pcVar10 == 'N' && (pcVar10[1] == '\0')) ||
         (iVar4 = strcmp(pcVar10,"NUM_STATES"), iVar4 == 0)) &&
        (iVar4 = __isoc99_sscanf(ppcVar9[1],"%d",&n_state), 0 < n_state && iVar4 == 1)))) {
      fsg = fsg_model_init(pcVar6,local_40,(float32)local_60,n_state);
      ckd_free(pcVar6);
      iVar5 = nextline_str2words(local_68,&lineno,&lineptr,&wordptr);
      ppcVar9 = wordptr;
      if ((iVar5 == 2) &&
         (((pcVar6 = *wordptr, *pcVar6 == 'S' && (pcVar6[1] == '\0')) ||
          (iVar4 = strcmp(pcVar6,"START_STATE"), iVar4 == 0)))) {
        iVar4 = __isoc99_sscanf(ppcVar9[1],"%d",&fsg->start_state);
        if (((iVar4 != 1) || (iVar4 = fsg->start_state, iVar4 < 0)) || (fsg->n_state <= iVar4))
        goto LAB_00105857;
        iVar5 = nextline_str2words(local_68,&lineno,&lineptr,&wordptr);
        ppcVar9 = wordptr;
        if ((iVar5 == 2) &&
           (((pcVar6 = *wordptr, *pcVar6 == 'F' && (pcVar6[1] == '\0')) ||
            (iVar4 = strcmp(pcVar6,"FINAL_STATE"), iVar4 == 0)))) {
          iVar4 = __isoc99_sscanf(ppcVar9[1],"%d",&fsg->final_state);
          if (((iVar4 == 1) && (iVar4 = fsg->final_state, -1 < iVar4)) && (iVar4 < fsg->n_state)) {
            uVar3 = nextline_str2words(local_68,&lineno,&lineptr,&wordptr);
            if ((int)uVar3 < 1) {
              pgVar8 = (glist_t)0x0;
            }
            else {
              local_50 = 0;
              pgVar8 = (glist_t)0x0;
              local_48 = 0;
              local_60 = 0;
              do {
                ppcVar9 = wordptr;
                pcVar6 = *wordptr;
                iVar4 = strcmp(pcVar6,"FSG_END");
                phVar1 = local_58;
                if (iVar4 == 0) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x2aa,"FSG: %d states, %d unique words, %d transitions (%d null)\n",
                          (ulong)(uint)fsg->n_state,(ulong)(uint)local_58->inuse,local_60,local_48);
                  iVar4 = phVar1->inuse;
                  fsg->n_word = iVar4;
                  n_elem = (long)iVar4 + 10;
                  fsg->n_word_alloc = (int32)n_elem;
                  ppcVar9 = (char **)__ckd_calloc__(n_elem,8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                                  ,0x2b0);
                  fsg->vocab = ppcVar9;
                  for (phVar7 = hash_table_iter(phVar1); phVar7 != (hash_iter_t *)0x0;
                      phVar7 = hash_table_iter_next(phVar7)) {
                    fsg->vocab[*(int *)&phVar7->ent->val] = phVar7->ent->key;
                  }
                  hash_table_free(local_58);
                  pgVar8 = fsg_model_null_trans_closure(fsg,pgVar8);
                  glist_free(pgVar8);
                  ckd_free(lineptr);
                  ckd_free(wordptr);
                  return fsg;
                }
                if (((*pcVar6 != 'T') || (pcVar6[1] != '\0')) &&
                   (iVar4 = strcmp(pcVar6,"TRANSITION"), iVar4 != 0)) {
                  uVar12 = (ulong)(uint)lineno;
                  pcVar6 = "Line[%d]: transition or FSG_END statement expected\n";
                  lVar11 = 0x28f;
                  goto LAB_001058d6;
                }
                if (((((uVar3 - 6 < 0xfffffffe) ||
                      (iVar4 = __isoc99_sscanf(ppcVar9[1],"%d",&i), iVar4 != 1)) ||
                     (iVar4 = __isoc99_sscanf(ppcVar9[2],"%d",&j), iVar4 != 1)) ||
                    ((i < 0 || (fsg->n_state <= i)))) || ((j < 0 || (fsg->n_state <= j)))) {
                  uVar12 = (ulong)(uint)lineno;
                  pcVar6 = 
                  "Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n"
                  ;
                  lVar11 = 0x281;
                  goto LAB_001058d6;
                }
                dVar14 = atof_c(ppcVar9[3]);
                fVar13 = (float)dVar14;
                if ((fVar13 <= 0.0) || (1.0 < fVar13)) {
                  uVar12 = (ulong)(uint)lineno;
                  pcVar6 = 
                  "Line[%d]: transition spec malformed; Expecting float as transition probability\n"
                  ;
                  lVar11 = 0x289;
                  goto LAB_001058d6;
                }
                iVar4 = logmath_log(local_40,(float64)(double)fVar13);
                iVar4 = (int)((float)iVar4 * (float)fsg->lw);
                if (uVar3 < 5) {
                  iVar5 = fsg_model_tag_trans_add(fsg,i,j,iVar4,(int32)in_R8);
                  if (iVar5 == 1) {
                    local_48 = (ulong)((int)local_48 + 1);
                    ptr = fsg_model_null_trans(fsg,i,j);
                    pgVar8 = glist_add_ptr(pgVar8,ptr);
                  }
                }
                else {
                  iVar5 = hash_table_lookup_int32(local_58,ppcVar9[4],&wid);
                  if (iVar5 < 0) {
                    pcVar6 = __ckd_salloc__(ppcVar9[4],
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                            ,0x298);
                    iVar2 = local_50;
                    hash_table_enter(local_58,pcVar6,(void *)(long)local_50);
                    wid = iVar2;
                    local_50 = iVar2 + 1;
                  }
                  in_R8 = (ulong)(uint)wid;
                  fsg_model_trans_add(fsg,i,j,iVar4,wid);
                  local_60 = (ulong)((int)local_60 + 1);
                }
                uVar3 = nextline_str2words(local_68,&lineno,&lineptr,&wordptr);
              } while (0 < (int)uVar3);
            }
            uVar12 = (ulong)(uint)lineno;
            pcVar6 = "Line[%d]: transition or FSG_END statement expected\n";
            lVar11 = 0x26e;
LAB_001058d6:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                    ,lVar11,pcVar6,uVar12);
            pcVar6 = (char *)0x0;
            goto LAB_00105493;
          }
        }
        pcVar10 = "Line[%d]: final state declaration line missing or malformed\n";
        lVar11 = 0x261;
      }
      else {
LAB_00105857:
        pcVar10 = "Line[%d]: start state declaration line missing or malformed\n";
        lVar11 = 0x253;
      }
      pcVar6 = (char *)0x0;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,lVar11,pcVar10,(ulong)(uint)lineno);
      pgVar8 = (glist_t)0x0;
      goto LAB_00105493;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x240,"Line[%d]: #states declaration line missing or malformed\n",(ulong)(uint)lineno);
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x226,"Line[%d]: malformed FSG_BEGIN declaration\n",(ulong)(uint)lineno);
LAB_0010539d:
    pcVar6 = (char *)0x0;
  }
  pgVar8 = (glist_t)0x0;
  fsg = (fsg_model_t *)0x0;
LAB_00105493:
  phVar1 = local_58;
  for (phVar7 = hash_table_iter(local_58); phVar7 != (hash_iter_t *)0x0;
      phVar7 = hash_table_iter_next(phVar7)) {
    ckd_free(phVar7->ent->key);
  }
  glist_free(pgVar8);
  hash_table_free(phVar1);
  ckd_free(pcVar6);
  ckd_free(lineptr);
  ckd_free(wordptr);
  fsg_model_free(fsg);
  return (fsg_model_t *)0x0;
}

Assistant:

fsg_model_t *
fsg_model_read(FILE * fp, logmath_t * lmath, float32 lw)
{
    fsg_model_t *fsg;
    hash_table_t *vocab;
    hash_iter_t *itor;
    int32 lastwid;
    char **wordptr;
    char *lineptr;
    char *fsgname;
    int32 lineno;
    int32 n, i, j;
    int n_state, n_trans, n_null_trans;
    glist_t nulls;
    float32 p;

    lineno = 0;
    vocab = hash_table_new(32, FALSE);
    wordptr = NULL;
    lineptr = NULL;
    nulls = NULL;
    fsgname = NULL;
    fsg = NULL;

    /* Scan upto FSG_BEGIN header */
    for (;;) {
        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n < 0) {
            E_ERROR("%s declaration missing\n", FSG_MODEL_BEGIN_DECL);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_BEGIN_DECL) == 0)) {
            if (n > 2) {
                E_ERROR("Line[%d]: malformed FSG_BEGIN declaration\n",
                        lineno);
                goto parse_error;
            }
            break;
        }
    }
    /* Save FSG name, or it will get clobbered below :(.
     * If name is missing, try the default.
     */
    if (n == 2) {
        fsgname = ckd_salloc(wordptr[1]);
    }
    else {
        E_WARN("FSG name is missing\n");
        fsgname = ckd_salloc("unknown");
    }

    /* Read #states */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_N_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_NUM_STATES_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &n_state) != 1)
        || (n_state <= 0)) {
        E_ERROR
            ("Line[%d]: #states declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Now create the FSG. */
    fsg = fsg_model_init(fsgname, lmath, lw, n_state);
    ckd_free(fsgname);
    fsgname = NULL;

    /* Read start state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_S_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_START_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->start_state)) != 1)
        || (fsg->start_state < 0)
        || (fsg->start_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: start state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read final state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_F_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_FINAL_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->final_state)) != 1)
        || (fsg->final_state < 0)
        || (fsg->final_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: final state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read transitions */
    lastwid = 0;
    n_trans = n_null_trans = 0;
    for (;;) {
        int32 wid, tprob;

        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n <= 0) {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_END_DECL) == 0)) {
            break;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_T_DECL) == 0)
            || (strcmp(wordptr[0], FSG_MODEL_TRANSITION_DECL) == 0)) {


            if (((n != 4) && (n != 5))
                || (sscanf(wordptr[1], "%d", &i) != 1)
                || (sscanf(wordptr[2], "%d", &j) != 1)
                || (i < 0) || (i >= fsg->n_state)
                || (j < 0) || (j >= fsg->n_state)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n",
                     lineno);
                goto parse_error;
            }

            p = atof_c(wordptr[3]);
            if ((p <= 0.0) || (p > 1.0)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting float as transition probability\n",
                     lineno);
                goto parse_error;
            }
        }
        else {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        tprob = (int32) (logmath_log(lmath, p) * fsg->lw);
        /* Add word to "dictionary". */
        if (n > 4) {
            if (hash_table_lookup_int32(vocab, wordptr[4], &wid) < 0) {
                (void) hash_table_enter_int32(vocab,
                                              ckd_salloc(wordptr[4]),
                                              lastwid);
                wid = lastwid;
                ++lastwid;
            }
            fsg_model_trans_add(fsg, i, j, tprob, wid);
            ++n_trans;
        }
        else {
            if (fsg_model_null_trans_add(fsg, i, j, tprob) == 1) {
                ++n_null_trans;
                nulls =
                    glist_add_ptr(nulls, fsg_model_null_trans(fsg, i, j));
            }
        }
    }

    E_INFO("FSG: %d states, %d unique words, %d transitions (%d null)\n",
           fsg->n_state, hash_table_inuse(vocab), n_trans, n_null_trans);


    /* Now create a string table from the "dictionary" */
    fsg->n_word = hash_table_inuse(vocab);
    fsg->n_word_alloc = fsg->n_word + 10;       /* Pad it a bit. */
    fsg->vocab = ckd_calloc(fsg->n_word_alloc, sizeof(*fsg->vocab));
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor)) {
        char const *word = hash_entry_key(itor->ent);
        int32 wid = (int32) (size_t) hash_entry_val(itor->ent);
        fsg->vocab[wid] = (char *) word;
    }
    hash_table_free(vocab);

    /* Do transitive closure on null transitions.  FIXME: This is
     * actually quite inefficient as it *creates* a lot of new links
     * as opposed to just *calculating* the epsilon-closure for each
     * state.  Ideally we would epsilon-remove or determinize the FSG
     * (but note that tag transitions are not really epsilons...) */
    nulls = fsg_model_null_trans_closure(fsg, nulls);
    glist_free(nulls);

    ckd_free(lineptr);
    ckd_free(wordptr);

    return fsg;

  parse_error:
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor))
        ckd_free((char *) hash_entry_key(itor->ent));
    glist_free(nulls);
    hash_table_free(vocab);
    ckd_free(fsgname);
    ckd_free(lineptr);
    ckd_free(wordptr);
    fsg_model_free(fsg);
    return NULL;
}